

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O2

void anon_unknown.dwarf_cd2a3::writeTimestamp(uint8_t *buffer,time_t time)

{
  tm *ptVar1;
  tm *ptVar2;
  time_t tVar3;
  time_t tVar4;
  time_t time_local;
  
  time_local = time;
  ptVar1 = localtime(&time_local);
  ptVar2 = localtime(&time_local);
  tVar3 = mktime(ptVar2);
  ptVar2 = gmtime(&time_local);
  tVar4 = mktime(ptVar2);
  *(ushort *)buffer = (ushort)((tVar3 - tVar4) / 0x3c) & 0xfff | 0x1000;
  *(short *)(buffer + 2) = (short)ptVar1->tm_year + 0x76c;
  buffer[4] = (char)ptVar1->tm_mon + '\x01';
  buffer[5] = (uint8_t)ptVar1->tm_mday;
  buffer[6] = (uint8_t)ptVar1->tm_hour;
  buffer[7] = (uint8_t)ptVar1->tm_min;
  buffer[8] = (uint8_t)ptVar1->tm_sec;
  buffer[9] = '\0';
  buffer[10] = '\0';
  buffer[0xb] = '\0';
  return;
}

Assistant:

void writeTimestamp(uint8_t *buffer, const time_t time)
{
    const auto buff16 = reinterpret_cast<uint16_t *>(buffer);

    const tm *parts = localtime(&time);

    const time_t lt = mktime(localtime(&time));
    const time_t gt = mktime(gmtime(&time));
    const auto timeZone = static_cast<int16_t>((lt - gt) / 60);

    buff16[0] = (1 << 12) + (timeZone & 0x0fff);
    buff16[1] = static_cast<int16_t>(parts->tm_year + 1900);
    buffer[4] = static_cast<uint8_t>(parts->tm_mon + 1);
    buffer[5] = static_cast<uint8_t>(parts->tm_mday);
    buffer[6] = static_cast<uint8_t>(parts->tm_hour);
    buffer[7] = static_cast<uint8_t>(parts->tm_min);
    buffer[8] = static_cast<uint8_t>(parts->tm_sec);
    buffer[9] = 0;  // ms parts
    buffer[10] = 0;
    buffer[11] = 0;
}